

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

int wallet::CalculateMaximumSignedInputSize
              (CTxOut *txout,COutPoint outpoint,SigningProvider *provider,bool can_grind_r,
              CCoinControl *coin_control)

{
  int64_t iVar1;
  int iVar2;
  pointer *__ptr;
  long in_FS_OFFSET;
  optional<long> oVar3;
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> desc;
  undefined1 local_98 [112];
  char local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (provider == (SigningProvider *)0x0) {
    iVar2 = -1;
  }
  else {
    InferDescriptor((CScript *)local_98,(SigningProvider *)&txout->scriptPubKey);
    iVar2 = -1;
    if ((Descriptor *)local_98._0_8_ != (Descriptor *)0x0) {
      local_28 = '\0';
      oVar3 = MaxInputWeight((Descriptor *)local_98._0_8_,(optional<CTxIn> *)(local_98 + 8),
                             coin_control,true,can_grind_r);
      if (local_28 == '\x01') {
        std::_Optional_payload_base<CTxIn>::_M_destroy
                  ((_Optional_payload_base<CTxIn> *)(local_98 + 8));
      }
      if (((undefined1  [16])
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        iVar1 = GetVirtualTransactionSize
                          (oVar3.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_payload,0,0);
        iVar2 = -1;
        if (((undefined1  [16])
             oVar3.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          iVar2 = (int)iVar1;
        }
      }
    }
    if ((Descriptor *)local_98._0_8_ != (Descriptor *)0x0) {
      (*(*(_func_int ***)local_98._0_8_)[1])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CalculateMaximumSignedInputSize(const CTxOut& txout, const COutPoint outpoint, const SigningProvider* provider, bool can_grind_r, const CCoinControl* coin_control)
{
    if (!provider) return -1;

    if (const auto desc = InferDescriptor(txout.scriptPubKey, *provider)) {
        if (const auto weight = MaxInputWeight(*desc, {}, coin_control, true, can_grind_r)) {
            return static_cast<int>(GetVirtualTransactionSize(*weight, 0, 0));
        }
    }

    return -1;
}